

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

void jsonrpccxx::check_param_type<int>(size_t index,json *x,value_t expectedType,type *param_4)

{
  value_t vVar1;
  int iVar2;
  longlong lVar3;
  JsonRpcException *pJVar4;
  unsigned_long_long uVar5;
  value_t t;
  value_t t_00;
  value_t t_01;
  value_t t_02;
  value_t t_03;
  value_t t_04;
  double dVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_199;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_141;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  type *local_28;
  type *param_3_local;
  json *pjStack_18;
  value_t expectedType_local;
  json *x_local;
  size_t index_local;
  
  local_28 = param_4;
  param_3_local._7_1_ = expectedType;
  pjStack_18 = x;
  x_local = (json *)index;
  if ((expectedType == number_unsigned) &&
     (vVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::type(x), vVar1 == number_integer)) {
    lVar3 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::get<long_long,long_long>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pjStack_18);
    if (lVar3 < 0) {
      local_e9 = 1;
      pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      type_name_abi_cxx11_(&local_a8,(jsonrpccxx *)(ulong)param_3_local._7_1_,t);
      std::operator+(&local_88,"invalid parameter: must be ",&local_a8);
      std::operator+(&local_68,&local_88,", but is ");
      vVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::type(pjStack_18);
      type_name_abi_cxx11_(&local_d8,(jsonrpccxx *)(ulong)vVar1,t_00);
      std::operator+(&local_48,&local_68,&local_d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_e8,(unsigned_long *)&x_local);
      JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_48,&local_e8);
      local_e9 = 0;
      __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
  }
  else {
    vVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::type(pjStack_18);
    if ((vVar1 == number_unsigned) && (param_3_local._7_1_ == number_integer)) {
      uVar5 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::get<unsigned_long_long,unsigned_long_long>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pjStack_18);
      iVar2 = std::numeric_limits<int>::max();
      if ((ulong)(long)iVar2 < uVar5) {
        local_141 = 1;
        pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
        type_name_abi_cxx11_(&local_130,(jsonrpccxx *)(ulong)param_3_local._7_1_,t_01);
        std::operator+(&local_110,"invalid parameter: exceeds value range of ",&local_130);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_140,(unsigned_long *)&x_local);
        JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_110,&local_140);
        local_141 = 0;
        __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
      }
    }
    else {
      vVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::type(pjStack_18);
      if (((vVar1 == number_unsigned) ||
          (vVar1 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::type(pjStack_18), vVar1 == number_integer)) &&
         (param_3_local._7_1_ == number_float)) {
        dVar6 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<double,double>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pjStack_18);
        lVar3 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::get<long_long,long_long>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pjStack_18);
        if ((long)dVar6 != lVar3) {
          local_199 = 1;
          pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
          type_name_abi_cxx11_(&local_188,(jsonrpccxx *)(ulong)param_3_local._7_1_,t_02);
          std::operator+(&local_168,"invalid parameter: exceeds value range of ",&local_188);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_198,(unsigned_long *)&x_local);
          JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_168,&local_198);
          local_199 = 0;
          __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
        }
      }
      else {
        vVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::type(pjStack_18);
        if (vVar1 != param_3_local._7_1_) {
          pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
          type_name_abi_cxx11_(&local_220,(jsonrpccxx *)(ulong)param_3_local._7_1_,t_03);
          std::operator+(&local_200,"invalid parameter: must be ",&local_220);
          std::operator+(&local_1e0,&local_200,", but is ");
          vVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::type(pjStack_18);
          type_name_abi_cxx11_(&local_240,(jsonrpccxx *)(ulong)vVar1,t_04);
          std::operator+(&local_1c0,&local_1e0,&local_240);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_250,(unsigned_long *)&x_local);
          JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_1c0,&local_250);
          __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
        }
      }
    }
  }
  return;
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<std::is_arithmetic<T>::value>::type * = 0) {
    if (expectedType == json::value_t::number_unsigned && x.type() == json::value_t::number_integer) {
      if (x.get<long long int>() < 0)
        throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    } else if (x.type() == json::value_t::number_unsigned && expectedType == json::value_t::number_integer) {
      if (x.get<long long unsigned>() > (long long unsigned)std::numeric_limits<T>::max()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    }
    else if ((x.type() == json::value_t::number_unsigned || x.type() == json::value_t::number_integer) && expectedType == json::value_t::number_float) {
      if (static_cast<long long int>(x.get<double>()) != x.get<long long int>()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    } else if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }